

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

UModelIndex * __thiscall
TreeModel::parent(UModelIndex *__return_storage_ptr__,TreeModel *this,UModelIndex *index)

{
  bool bVar1;
  int row;
  TreeItem *pTVar2;
  TreeItem *parentItem;
  TreeItem *childItem;
  UModelIndex *index_local;
  TreeModel *this_local;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    pTVar2 = (TreeItem *)UModelIndex::internalPointer(index);
    if (pTVar2 == this->rootItem) {
      UModelIndex::UModelIndex(__return_storage_ptr__);
    }
    else {
      pTVar2 = TreeItem::parent(pTVar2);
      if (pTVar2 == this->rootItem) {
        UModelIndex::UModelIndex(__return_storage_ptr__);
      }
      else {
        row = TreeItem::row(pTVar2);
        createIndex(__return_storage_ptr__,this,row,0,pTVar2);
      }
    }
  }
  else {
    UModelIndex::UModelIndex(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::parent(const UModelIndex &index) const
{
    if (!index.isValid())
        return UModelIndex();
    
    TreeItem *childItem = static_cast<TreeItem*>(index.internalPointer());
    if (childItem == rootItem)
        return UModelIndex();
    
    TreeItem *parentItem = childItem->parent();
    
    if (parentItem == rootItem)
        return UModelIndex();
    
    return createIndex(parentItem->row(), 0, parentItem);
}